

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zesDeviceEnumOverclockDomains
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_overclock_handle_t *phDomainHandle)

{
  zes_pfnDeviceEnumOverclockDomains_t p_Var1;
  ze_result_t zVar2;
  object_t<_zes_overclock_handle_t_*> *poVar3;
  ulong uVar4;
  dditable_t *dditable;
  dditable_t *local_38;
  
  local_38 = *(dditable_t **)(hDevice + 8);
  p_Var1 = (local_38->zes).Device.pfnEnumOverclockDomains;
  if (p_Var1 == (zes_pfnDeviceEnumOverclockDomains_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(zes_device_handle_t *)hDevice,pCount,phDomainHandle);
    if (((zVar2 == ZE_RESULT_SUCCESS) &&
        (zVar2 = ZE_RESULT_SUCCESS, phDomainHandle != (zes_overclock_handle_t *)0x0)) &&
       (*pCount != 0)) {
      uVar4 = 0;
      do {
        poVar3 = singleton_factory_t<object_t<_zes_overclock_handle_t*>,_zes_overclock_handle_t*>::
                 getInstance<_zes_overclock_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_zes_overclock_handle_t*>,_zes_overclock_handle_t*>
                             *)(context + 0xba0),phDomainHandle,&local_38);
        *phDomainHandle = (zes_overclock_handle_t)poVar3;
        uVar4 = uVar4 + 1;
        phDomainHandle = phDomainHandle + 1;
      } while (uVar4 < *pCount);
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEnumOverclockDomains(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of components of this type that are available.
                                                        ///< if count is greater than the number of components of this type that
                                                        ///< are available, then the driver shall update the value with the correct
                                                        ///< number of components.
        zes_overclock_handle_t* phDomainHandle          ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                        ///< this type.
                                                        ///< if count is less than the number of components of this type that are
                                                        ///< available, then the driver shall only retrieve that number of
                                                        ///< component handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_device_object_t*>( hDevice )->dditable;
        auto pfnEnumOverclockDomains = dditable->zes.Device.pfnEnumOverclockDomains;
        if( nullptr == pfnEnumOverclockDomains )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zes_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnEnumOverclockDomains( hDevice, pCount, phDomainHandle );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phDomainHandle ) && ( i < *pCount ); ++i )
                phDomainHandle[ i ] = reinterpret_cast<zes_overclock_handle_t>(
                    context->zes_overclock_factory.getInstance( phDomainHandle[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }